

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::Export_MetadataString
          (X3DExporter *this,aiString *pKey,aiString *pValue,size_t pTabLevel)

{
  allocator local_7a;
  allocator local_79;
  undefined1 local_78 [64];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&attr_list;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = 0;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       attr_list.
       super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string((string *)local_78,"name",&local_7a);
  std::__cxx11::string::string((string *)(local_78 + 0x20),pKey->data,&local_79);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            (&attr_list,(value_type *)local_78);
  SAttribute::~SAttribute((SAttribute *)local_78);
  std::__cxx11::string::string((string *)local_78,"value",&local_7a);
  std::__cxx11::string::string((string *)(local_78 + 0x20),pValue->data,&local_79);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            (&attr_list,(value_type *)local_78);
  SAttribute::~SAttribute((SAttribute *)local_78);
  std::__cxx11::string::string((string *)local_78,"MetadataString",&local_7a);
  NodeHelper_OpenNode(this,(string *)local_78,pTabLevel,true,&attr_list);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          );
  return;
}

Assistant:

void X3DExporter::Export_MetadataString(const aiString& pKey, const aiString& pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", pValue.C_Str()});
	NodeHelper_OpenNode("MetadataString", pTabLevel, true, attr_list);
}